

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::Norm
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  undefined **ppuVar1;
  TFad<6,_double> *pTVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  long lVar7;
  TFad<6,_double> *pTVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined **local_a8;
  double local_a0;
  undefined **ppuStack_98;
  double local_90 [6];
  undefined8 uStack_60;
  undefined **local_50;
  double local_48;
  undefined **local_40 [6];
  
  local_a8 = &PTR__TFad_0185d2b8;
  ppuStack_98 = (undefined **)0x0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  local_90[2] = 0.0;
  local_90[3] = 0.0;
  local_90[4] = 0.0;
  pTVar2 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  dVar3 = 0.0;
  lVar7 = 0;
  pTVar8 = pTVar2;
  do {
    dVar12 = pTVar2[lVar7].val_;
    lVar9 = 2;
    do {
      dVar10 = pTVar8->dx_[lVar9 + -2] * dVar12;
      dVar11 = (pTVar8->dx_ + lVar9 + -2)[1] * dVar12;
      (&local_a8)[lVar9] = (undefined **)((double)(&local_a8)[lVar9] + dVar10 + dVar10);
      (&local_a0)[lVar9] = (&local_a0)[lVar9] + dVar11 + dVar11;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 8);
    dVar3 = dVar3 + dVar12 * dVar12;
    lVar7 = lVar7 + 1;
    pTVar8 = pTVar8 + 1;
  } while (lVar7 != 6);
  pTVar2 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  dVar12 = pTVar2[1].val_;
  lVar7 = 2;
  do {
    dVar11 = pTVar2[1].dx_[lVar7 + -2] * dVar12;
    dVar10 = (pTVar2[1].dx_ + lVar7 + -2)[1] * dVar12;
    dVar10 = (&local_a0)[lVar7] + dVar10 + dVar10;
    auVar4._8_4_ = SUB84(dVar10,0);
    auVar4._0_8_ = (double)(&local_a8)[lVar7] + dVar11 + dVar11;
    auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])(&local_a8 + lVar7) = auVar4;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 8);
  dVar10 = pTVar2[2].val_;
  lVar7 = 0;
  do {
    dVar11 = pTVar2[2].dx_[lVar7] * dVar10;
    dVar5 = (pTVar2[2].dx_ + lVar7)[1] * dVar10;
    (&local_a0)[lVar7 + 1] = (&local_a0)[lVar7 + 1] + dVar11 + dVar11;
    (&local_a0)[lVar7 + 2] = (&local_a0)[lVar7 + 2] + dVar5 + dVar5;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  dVar11 = pTVar2[4].val_;
  lVar7 = 0;
  do {
    dVar5 = pTVar2[4].dx_[lVar7] * dVar11;
    dVar6 = (pTVar2[4].dx_ + lVar7)[1] * dVar11;
    (&local_a0)[lVar7 + 1] = (&local_a0)[lVar7 + 1] + dVar5 + dVar5;
    (&local_a0)[lVar7 + 2] = (&local_a0)[lVar7 + 2] + dVar6 + dVar6;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  local_a0 = dVar12 * dVar12 + dVar3 + dVar10 * dVar10 + dVar11 * dVar11;
  local_50 = &PTR__TFad_0185d2b8;
  local_40[0] = ppuStack_98;
  local_40[1] = (undefined **)local_90[0];
  local_40[2] = (undefined **)local_90[1];
  local_40[3] = (undefined **)local_90[2];
  local_40[4] = (undefined **)local_90[3];
  local_40[5] = (undefined **)local_90[4];
  (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  dVar3 = SQRT(local_a0);
  local_90[5] = local_a0;
  uStack_60 = 0;
  dVar12 = dVar3;
  local_48 = local_a0;
  if (local_a0 < 0.0) {
    dVar12 = sqrt(local_a0);
  }
  __return_storage_ptr__->val_ = dVar12;
  lVar7 = 2;
  dVar12 = local_90[5];
  do {
    ppuVar1 = (&local_50)[lVar7];
    dVar10 = dVar3;
    if (dVar12 < 0.0) {
      dVar10 = sqrt(dVar12);
      dVar12 = local_90[5];
    }
    __return_storage_ptr__->dx_[lVar7 + -2] = (double)ppuVar1 / (dVar10 + dVar10);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::Norm() const {
    T norm = T(0.);
    for (unsigned int i = 0; i < 6; i++) {
        norm += fData[i] * fData[i];
    }
    norm += fData[_XY_] * fData[_XY_];
    norm += fData[_XZ_] * fData[_XZ_];
    norm += fData[_YZ_] * fData[_YZ_];
    return sqrt(norm);
}